

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event_queue.cpp
# Opt level: O0

void __thiscall sc_core::sc_event_queue::sc_event_queue(sc_event_queue *this,sc_module_name *name_)

{
  sc_module_name *in_RSI;
  sc_event_queue_if *in_RDI;
  sc_process_handle fire_event_handle;
  SC_ENTRY_FUNC in_stack_00000188;
  bool in_stack_0000019f;
  char *in_stack_000001a0;
  sc_simcontext *in_stack_000001a8;
  sc_process_host *in_stack_000001d0;
  sc_spawn_options *in_stack_000001d8;
  undefined8 in_stack_ffffffffffffff58;
  int sz;
  sc_event_queue_if *orig;
  sc_ppq<sc_core::sc_time_*> *in_stack_ffffffffffffff60;
  sc_process_handle *this_00;
  sc_event *in_stack_ffffffffffffff68;
  sc_module *this_01;
  sc_process_handle *in_stack_ffffffffffffff78;
  sc_event_queue_if *handle_;
  sc_sensitive *this_02;
  sc_module *in_stack_ffffffffffffffb0;
  
  sz = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  sc_interface::sc_interface((sc_interface *)in_RDI);
  sc_event_queue_if::sc_event_queue_if(in_RDI,&PTR_PTR_0035de98);
  sc_module::sc_module(in_stack_ffffffffffffffb0,in_RSI);
  *in_RDI = (sc_event_queue_if)&PTR_register_port_0035dd88;
  *in_RDI = (sc_event_queue_if)&PTR_register_port_0035dd88;
  in_RDI[1] = (sc_event_queue_if)&PTR_print_0035ddd8;
  in_RDI[0xf] = (sc_event_queue_if)&PTR__sc_event_queue_0035de80;
  sc_ppq<sc_core::sc_time_*>::sc_ppq(in_stack_ffffffffffffff60,sz,(compare_fn_t)0x222b43);
  sc_event::sc_event((sc_event *)(in_RDI + 0x21),0);
  in_RDI[0x36] = (sc_event_queue_if)0x0;
  *(undefined4 *)(in_RDI + 0x37) = 0;
  sc_get_curr_simcontext();
  orig = in_RDI + 0xf;
  this_00 = (sc_process_handle *)0x0;
  sc_simcontext::create_method_process
            (in_stack_000001a8,in_stack_000001a0,in_stack_0000019f,in_stack_00000188,
             in_stack_000001d0,in_stack_000001d8);
  this_02 = (sc_sensitive *)(in_RDI + 0x10);
  sc_process_handle::sc_process_handle(this_00,(sc_process_handle *)orig);
  sc_sensitive::operator<<(this_02,in_stack_ffffffffffffff78);
  sc_process_handle::~sc_process_handle(this_00);
  handle_ = in_RDI + 0x13;
  sc_process_handle::sc_process_handle(this_00,(sc_process_handle *)orig);
  sc_sensitive_pos::operator<<((sc_sensitive_pos *)this_02,(sc_process_handle *)handle_);
  sc_process_handle::~sc_process_handle(this_00);
  this_01 = (sc_module *)(in_RDI + 0x16);
  sc_process_handle::sc_process_handle(this_00,(sc_process_handle *)orig);
  sc_sensitive_neg::operator<<((sc_sensitive_neg *)this_02,(sc_process_handle *)handle_);
  sc_process_handle::~sc_process_handle(this_00);
  sc_process_handle::~sc_process_handle(this_00);
  sc_sensitive::operator<<((sc_sensitive *)this_01,in_stack_ffffffffffffff68);
  sc_module::dont_initialize(this_01);
  return;
}

Assistant:

sc_event_queue::sc_event_queue( sc_module_name name_ )
    : sc_module( name_ ),
      m_ppq( 128, sc_time_compare ),
      m_e( sc_event::kernel_event ),
      m_change_stamp(0),
      m_pending_delta(0)
{
    SC_METHOD( fire_event );
    sensitive << m_e;
    dont_initialize();
}